

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O2

void __thiscall CCollision::Init(CCollision *this,CLayers *pLayers)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  uchar uVar6;
  CTile *pCVar4;
  
  this->m_pLayers = pLayers;
  iVar3 = pLayers->m_pGameLayer->m_Height;
  this->m_Width = pLayers->m_pGameLayer->m_Width;
  this->m_Height = iVar3;
  iVar3 = (*(pLayers->m_pMap->super_IInterface)._vptr_IInterface[2])();
  pCVar4 = (CTile *)CONCAT44(extraout_var,iVar3);
  this->m_pTiles = pCVar4;
  iVar3 = this->m_Width;
  iVar2 = this->m_Height;
  for (lVar5 = 0; lVar5 < (long)iVar2 * (long)iVar3; lVar5 = lVar5 + 1) {
    bVar1 = pCVar4[lVar5].m_Index;
    if (bVar1 < 0x81) {
      uVar6 = (uchar)(0x5020100 >> ((bVar1 & 3) << 3));
      if (3 < bVar1) {
        uVar6 = '\0';
      }
      pCVar4[lVar5].m_Index = uVar6;
    }
  }
  return;
}

Assistant:

void CCollision::Init(class CLayers *pLayers)
{
	m_pLayers = pLayers;
	m_Width = m_pLayers->GameLayer()->m_Width;
	m_Height = m_pLayers->GameLayer()->m_Height;
	m_pTiles = static_cast<CTile *>(m_pLayers->Map()->GetData(m_pLayers->GameLayer()->m_Data));

	for(int i = 0; i < m_Width*m_Height; i++)
	{
		int Index = m_pTiles[i].m_Index;

		if(Index > 128)
			continue;

		switch(Index)
		{
		case TILE_DEATH:
			m_pTiles[i].m_Index = COLFLAG_DEATH;
			break;
		case TILE_SOLID:
			m_pTiles[i].m_Index = COLFLAG_SOLID;
			break;
		case TILE_NOHOOK:
			m_pTiles[i].m_Index = COLFLAG_SOLID|COLFLAG_NOHOOK;
			break;
		default:
			m_pTiles[i].m_Index = 0;
		}
	}
}